

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::auto_manage_torrents
          (session_impl *this,
          vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *list,
          int *dht_limit,int *tracker_limit,int *lsd_limit,int *hard_limit,int type_limit)

{
  int iVar1;
  torrent *ptVar2;
  bool bVar3;
  bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void> flags;
  pause_flags_t local_5a;
  pause_flags_t local_59;
  reference local_58;
  torrent **t;
  iterator __end2;
  iterator __begin2;
  vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *__range2;
  int *hard_limit_local;
  int *lsd_limit_local;
  int *tracker_limit_local;
  int *dht_limit_local;
  vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *list_local;
  session_impl *this_local;
  
  __end2 = ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::
           begin(list);
  t = (torrent **)
      ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::end
                (list);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<libtorrent::aux::torrent_**,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
                                     *)&t), bVar3) {
    local_58 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::torrent_**,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
               ::operator*(&__end2);
    if ((*hard_limit < 1) || (bVar3 = torrent::is_inactive(*local_58), !bVar3)) {
      if ((type_limit < 1) || (*hard_limit < 1)) {
        bVar3 = torrent::is_torrent_paused(*local_58);
        if (!bVar3) {
          torrent::log_to_all_peers(*local_58,"auto manager pausing torrent");
        }
        ptVar2 = *local_58;
        flags = libtorrent::flags::operator|
                          ((bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>)'\x01',
                           (bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>)'\x02');
        torrent::set_paused(ptVar2,true,(pause_flags_t)flags.m_val);
        torrent::set_announce_to_dht(*local_58,false);
        torrent::set_announce_to_trackers(*local_58,false);
        torrent::set_announce_to_lsd(*local_58,false);
      }
      else {
        ptVar2 = *local_58;
        iVar1 = *dht_limit;
        *dht_limit = iVar1 + -1;
        torrent::set_announce_to_dht(ptVar2,-1 < iVar1 + -1);
        ptVar2 = *local_58;
        iVar1 = *tracker_limit;
        *tracker_limit = iVar1 + -1;
        torrent::set_announce_to_trackers(ptVar2,-1 < iVar1 + -1);
        ptVar2 = *local_58;
        iVar1 = *lsd_limit;
        *lsd_limit = iVar1 + -1;
        torrent::set_announce_to_lsd(ptVar2,-1 < iVar1 + -1);
        *hard_limit = *hard_limit + -1;
        type_limit = type_limit + -1;
        bVar3 = torrent::is_torrent_paused(*local_58);
        if (bVar3) {
          torrent::log_to_all_peers(*local_58,"auto manager starting torrent");
        }
        ptVar2 = *local_58;
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
        bitfield_flag(&local_5a);
        torrent::set_paused(ptVar2,false,local_5a);
      }
    }
    else {
      ptVar2 = *local_58;
      iVar1 = *dht_limit;
      *dht_limit = iVar1 + -1;
      torrent::set_announce_to_dht(ptVar2,-1 < iVar1 + -1);
      ptVar2 = *local_58;
      iVar1 = *tracker_limit;
      *tracker_limit = iVar1 + -1;
      torrent::set_announce_to_trackers(ptVar2,-1 < iVar1 + -1);
      ptVar2 = *local_58;
      iVar1 = *lsd_limit;
      *lsd_limit = iVar1 + -1;
      torrent::set_announce_to_lsd(ptVar2,-1 < iVar1 + -1);
      *hard_limit = *hard_limit + -1;
      bVar3 = torrent::is_torrent_paused(*local_58);
      if (bVar3) {
        torrent::log_to_all_peers(*local_58,"auto manager starting (inactive) torrent");
      }
      ptVar2 = *local_58;
      libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::pause_flags_tag,_void>::
      bitfield_flag(&local_59);
      torrent::set_paused(ptVar2,false,local_59);
    }
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::torrent_**,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void session_impl::auto_manage_torrents(std::vector<torrent*>& list
		, int& dht_limit, int& tracker_limit
		, int& lsd_limit, int& hard_limit, int type_limit)
	{
		for (auto& t : list)
		{
			TORRENT_ASSERT(t->state() != torrent_status::checking_files);

			// inactive torrents don't count (and if you configured them to do so,
			// the torrent won't say it's inactive)
			if (hard_limit > 0 && t->is_inactive())
			{
				t->set_announce_to_dht(--dht_limit >= 0);
				t->set_announce_to_trackers(--tracker_limit >= 0);
				t->set_announce_to_lsd(--lsd_limit >= 0);

				--hard_limit;
#ifndef TORRENT_DISABLE_LOGGING
				if (t->is_torrent_paused())
					t->log_to_all_peers("auto manager starting (inactive) torrent");
#endif
				t->set_paused(false);
				continue;
			}

			if (type_limit > 0 && hard_limit > 0)
			{
				t->set_announce_to_dht(--dht_limit >= 0);
				t->set_announce_to_trackers(--tracker_limit >= 0);
				t->set_announce_to_lsd(--lsd_limit >= 0);

				--hard_limit;
				--type_limit;
#ifndef TORRENT_DISABLE_LOGGING
				if (t->is_torrent_paused())
					t->log_to_all_peers("auto manager starting torrent");
#endif
				t->set_paused(false);
				continue;
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (!t->is_torrent_paused())
				t->log_to_all_peers("auto manager pausing torrent");
#endif
			// use graceful pause for auto-managed torrents
			t->set_paused(true, torrent_handle::graceful_pause
				| torrent_handle::clear_disk_cache);
			t->set_announce_to_dht(false);
			t->set_announce_to_trackers(false);
			t->set_announce_to_lsd(false);
		}
	}